

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::mlFg_Update(HModel *this,int mlFg_action)

{
  if (this->mlFg_action_TransposeLP == mlFg_action) {
    this->mlFg_transposedLP = 0;
    this->mlFg_scaledLP = 0;
    this->mlFg_shuffledLP = 0;
    this->mlFg_haveBasis = 0;
    this->mlFg_haveInvert = 0;
    this->mlFg_haveFreshInvert = 0;
    this->mlFg_haveNonbasicDuals = 0;
    this->mlFg_haveBasicPrimals = 0;
    this->mlFg_haveMatrixColWise = 0;
    this->mlFg_haveMatrixRowWise = 0;
    this->mlFg_haveFactorArrays = 0;
    this->mlFg_haveEdWt = 0;
    this->mlFg_haveFreshRebuild = 0;
    this->mlFg_haveSavedBounds = 0;
    this->problemStatus = -1;
    this->mlFg_transposedLP = 1;
    return;
  }
  if (this->mlFg_action_ScaleLP == mlFg_action) {
    this->problemStatus = -1;
    this->mlFg_scaledLP = 1;
    this->mlFg_haveFreshRebuild = 0;
    this->mlFg_haveMatrixColWise = 0;
    this->mlFg_haveMatrixRowWise = 0;
    this->mlFg_haveFactorArrays = 0;
    this->mlFg_haveEdWt = 0;
    this->mlFg_haveInvert = 0;
    this->mlFg_haveFreshInvert = 0;
    populate_WorkArrays(this);
    return;
  }
  if (this->mlFg_action_ShuffleLP == mlFg_action) {
    this->problemStatus = -1;
    this->mlFg_shuffledLP = 1;
    this->mlFg_haveBasis = 0;
    this->mlFg_haveFreshRebuild = 0;
    this->mlFg_haveMatrixRowWise = 0;
    this->mlFg_haveFactorArrays = 0;
    this->mlFg_haveEdWt = 0;
    this->mlFg_haveInvert = 0;
    this->mlFg_haveFreshInvert = 0;
    return;
  }
  if (this->mlFg_action_NewBounds == mlFg_action) {
    this->problemStatus = -1;
    initBound(this,2);
    initValueFromNonbasic(this,0,this->numTot + -1);
LAB_0012985e:
    this->mlFg_haveBasicPrimals = 0;
    this->mlFg_haveFreshRebuild = 0;
  }
  else {
    if (this->mlFg_action_NewCosts == mlFg_action) {
      this->problemStatus = -1;
      initCost(this,0);
      this->mlFg_haveNonbasicDuals = 0;
      this->mlFg_haveFreshRebuild = 0;
      return;
    }
    if (this->mlFg_action_NewBasis != mlFg_action) {
      if (this->mlFg_action_NewCols == mlFg_action) {
        this->problemStatus = -1;
        this->mlFg_haveBasis = 1;
        this->mlFg_haveMatrixColWise = 0;
        this->mlFg_haveMatrixRowWise = 0;
        this->mlFg_haveFactorArrays = 0;
        this->mlFg_haveEdWt = 0;
        this->mlFg_haveInvert = 0;
        this->mlFg_haveFreshInvert = 0;
        this->mlFg_haveNonbasicDuals = 0;
        this->mlFg_haveBasicPrimals = 0;
        return;
      }
      if (this->mlFg_action_NewRows != mlFg_action) {
        if (this->mlFg_action_DelCols == mlFg_action) {
          this->problemStatus = -1;
          this->mlFg_haveBasis = 0;
          this->mlFg_haveMatrixColWise = 0;
          this->mlFg_haveMatrixRowWise = 0;
          this->mlFg_haveFactorArrays = 0;
          this->mlFg_haveEdWt = 0;
          this->mlFg_haveInvert = 0;
          this->mlFg_haveFreshInvert = 0;
          this->mlFg_haveNonbasicDuals = 0;
          this->mlFg_haveBasicPrimals = 0;
          return;
        }
        if (this->mlFg_action_DelRows == mlFg_action) {
          this->problemStatus = -1;
          this->mlFg_haveBasis = 0;
          this->mlFg_haveMatrixColWise = 0;
          this->mlFg_haveMatrixRowWise = 0;
          this->mlFg_haveFactorArrays = 0;
          this->mlFg_haveEdWt = 0;
          this->mlFg_haveInvert = 0;
          this->mlFg_haveFreshInvert = 0;
          this->mlFg_haveNonbasicDuals = 0;
          goto LAB_0012985e;
        }
        if (this->mlFg_action_DelRowsBasisOK != mlFg_action) {
          printf("Unrecognised mlFg_action = %d\n");
          return;
        }
      }
    }
    this->problemStatus = -1;
    this->mlFg_haveBasis = 1;
    this->mlFg_haveMatrixColWise = 0;
    this->mlFg_haveMatrixRowWise = 0;
    this->mlFg_haveFactorArrays = 0;
    this->mlFg_haveEdWt = 0;
    this->mlFg_haveInvert = 0;
    this->mlFg_haveFreshInvert = 0;
    this->mlFg_haveNonbasicDuals = 0;
    this->mlFg_haveBasicPrimals = 0;
    this->mlFg_haveFreshRebuild = 0;
  }
  return;
}

Assistant:

void HModel::mlFg_Update(int mlFg_action) {
  //  switch(mlFg_action) {
  if (mlFg_action == mlFg_action_TransposeLP) {
    //The LP has just been transposed
    //Want to clear all flags since model is totally different
    //Should not clear flags if model is scaled
    assert(mlFg_scaledLP = 0);
    //Clear the model flags, but indicate that it's transposed
    mlFg_Clear();
    problemStatus = LP_Status_Unset;
    mlFg_transposedLP = 1;
  }
  else if (mlFg_action == mlFg_action_ScaleLP) {
    //The LP has just been scaled
    problemStatus = LP_Status_Unset;
    mlFg_scaledLP = 1;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveFreshRebuild = 0;

    populate_WorkArrays();
    
  }
  else if (mlFg_action == mlFg_action_ShuffleLP) {
    //The LP has been shuffled
    //Indicate that the columns have been shuffled
    problemStatus = LP_Status_Unset;
    mlFg_shuffledLP = 1;
    mlFg_haveBasis = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else if (mlFg_action == mlFg_action_NewBounds) {
    //New bounds have been defined
    problemStatus = LP_Status_Unset;
    initBound();
    initValue();
    mlFg_haveBasicPrimals = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else if (mlFg_action == mlFg_action_NewCosts) {
    //New costs have been defined
    problemStatus = LP_Status_Unset;
    initCost();
    mlFg_haveNonbasicDuals = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else if (mlFg_action == mlFg_action_NewBasis) {
    //A new basis has been defined
    problemStatus = LP_Status_Unset;
    mlFg_haveBasis = 1;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveBasicPrimals = 0;
    mlFg_haveNonbasicDuals = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else if (mlFg_action == mlFg_action_NewCols) {
    //New columns have been added as nonbasic
    problemStatus = LP_Status_Unset;
    mlFg_haveBasis = 1;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveBasicPrimals = 0;
    mlFg_haveNonbasicDuals = 0;
  }
  else if (mlFg_action == mlFg_action_NewRows) {
    //New rows have been added as basic
    problemStatus = LP_Status_Unset;
    mlFg_haveBasis = 1;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveBasicPrimals = 0;
    mlFg_haveNonbasicDuals = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else if (mlFg_action == mlFg_action_DelCols) {
    //Columns have been deleted
    problemStatus = LP_Status_Unset;
    mlFg_haveBasis = 0;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveBasicPrimals = 0;
    mlFg_haveNonbasicDuals = 0;
  }
  else if (mlFg_action == mlFg_action_DelRows) {
    //Rows have been deleted
    problemStatus = LP_Status_Unset;
    mlFg_haveBasis = 0;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveBasicPrimals = 0;
    mlFg_haveNonbasicDuals = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else if (mlFg_action == mlFg_action_DelRowsBasisOK) {
    //Rows have been deleted
    problemStatus = LP_Status_Unset;
    mlFg_haveBasis = 1;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveBasicPrimals = 0;
    mlFg_haveNonbasicDuals = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else {
    printf("Unrecognised mlFg_action = %d\n", mlFg_action);
  }
}